

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O2

void pty_close(Pty *pty)

{
  int in_register_00000004;
  long lVar1;
  
  if (-1 < pty->master_o) {
    uxsel_del(in_register_00000004);
  }
  if (-1 < pty->master_e) {
    uxsel_del(in_register_00000004);
  }
  if (-1 < pty->master_i) {
    uxsel_del(in_register_00000004);
  }
  if (-1 < pty->master_fd) {
    close(pty->master_fd);
    pty->master_fd = -1;
  }
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    if (-1 < pty->pipefds[lVar1]) {
      close(pty->pipefds[lVar1]);
    }
    pty->pipefds[lVar1] = -1;
  }
  pty->master_e = -1;
  pty->master_i = -1;
  pty->master_o = -1;
  if (-1 < pty_utmp_helper_pipe) {
    close(pty_utmp_helper_pipe);
    pty_utmp_helper_pipe = -1;
  }
  return;
}

Assistant:

static void pty_close(Pty *pty)
{
    int i;

    if (pty->master_o >= 0)
        uxsel_del(pty->master_o);
    if (pty->master_e >= 0)
        uxsel_del(pty->master_e);
    if (pty->master_i >= 0)
        uxsel_del(pty->master_i);

    if (pty->master_fd >= 0) {
        close(pty->master_fd);
        pty->master_fd = -1;
    }
    for (i = 0; i < 6; i++) {
        if (pty->pipefds[i] >= 0)
            close(pty->pipefds[i]);
        pty->pipefds[i] = -1;
    }
    pty->master_i = pty->master_o = pty->master_e = -1;
#ifndef OMIT_UTMP
    if (pty_utmp_helper_pipe >= 0) {
        close(pty_utmp_helper_pipe);   /* this causes utmp to be cleaned up */
        pty_utmp_helper_pipe = -1;
    }
#endif
}